

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# features.c
# Opt level: O2

void faup_features_find(faup_handler_t *fh,char *url,size_t url_len)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  ushort **ppuVar17;
  int iVar18;
  long lVar19;
  faup_features_t *features;
  size_t sVar20;
  size_t sVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  size_t sVar25;
  ulong uVar26;
  
  features = &(fh->faup).features;
  faup_features_init(features);
  bVar16 = false;
  uVar22 = 0;
  lVar23 = 0;
  sVar20 = 0xffffffffffffffff;
  sVar25 = 0;
  do {
    if (url_len == sVar25) {
      return;
    }
    uVar26 = sVar25 + 1;
    iVar18 = 0;
    if (uVar26 < url_len) {
      iVar18 = (int)url[sVar25 + 1];
    }
    cVar1 = url[sVar25];
    sVar21 = sVar20;
    if ((!bVar16) || (cVar1 == ']')) {
      iVar24 = (int)sVar25;
      if (cVar1 == '#') {
        if ((sVar25 != sVar20) &&
           (lVar19._0_4_ = (fh->faup).features.fragment.field,
           lVar19._4_4_ = (fh->faup).features.fragment.pos, lVar19 < 0)) {
          (fh->faup).features.fragment.pos = iVar24;
        }
      }
      else if (cVar1 == ']') {
        bVar16 = false;
      }
      else if (cVar1 == ':') {
        lVar6._0_4_ = (fh->faup).features.port.field;
        lVar6._4_4_ = (fh->faup).features.port.pos;
        if ((lVar6 < 0) && (uVar22 < 2)) {
          ppuVar17 = __ctype_b_loc();
          if (((*ppuVar17)[iVar18] & 8) == 0) {
            sVar21 = uVar26;
            if ((iVar18 == 0x3a) && (sVar21 = sVar20, (fh->faup).features.host.pos < 0)) {
              (fh->faup).features.host.pos = iVar24;
              (fh->faup).url_type = FAUP_URL_IPV6;
LAB_00114c99:
              bVar16 = true;
              sVar21 = sVar20;
            }
          }
          else {
            (fh->faup).features.port.pos = iVar24 + 1;
          }
        }
      }
      else if (cVar1 == '?') {
        if (sVar25 != sVar20) {
          if (uVar22 == 2) goto LAB_00114c6d;
          if ((uVar22 < 2) &&
             (lVar11._0_4_ = (fh->faup).features.resource_path.field,
             lVar11._4_4_ = (fh->faup).features.resource_path.pos, lVar11 < 0)) {
            lVar12._0_4_ = (features->scheme).field;
            lVar12._4_4_ = (features->scheme).pos;
            if (lVar12 < 0) {
              lVar15._0_4_ = (fh->faup).features.hierarchical.field;
              lVar15._4_4_ = (fh->faup).features.hierarchical.pos;
              if (lVar15 < 0) goto LAB_00114c6d;
            }
            else {
              lVar13._0_4_ = (fh->faup).features.host.field;
              lVar13._4_4_ = (fh->faup).features.host.pos;
              if (-1 < lVar13) {
LAB_00114c6d:
                lVar2._0_4_ = (fh->faup).features.query_string.field;
                lVar2._4_4_ = (fh->faup).features.query_string.pos;
                if (lVar2 < 0) {
                  (fh->faup).features.query_string.pos = iVar24;
                }
                uVar22 = 2;
              }
            }
          }
        }
      }
      else if (cVar1 == '@') {
        if (((sVar25 != sVar20 && uVar22 < 2) &&
            (lVar3._0_4_ = (fh->faup).features.credential.field,
            lVar3._4_4_ = (fh->faup).features.credential.pos, lVar3 < 0)) &&
           ((sVar25 == 0 || (url[sVar25 - 1] != '@')))) {
          (fh->faup).features.credential.pos = (fh->faup).features.host.pos;
          (fh->faup).features.host.pos = iVar24 + 1;
          (fh->faup).features.port.pos = -1;
        }
      }
      else if (cVar1 == '[') {
        if ((fh->faup).features.host.pos < 0) {
          (fh->faup).features.host.pos = iVar24;
          goto LAB_00114c99;
        }
      }
      else if (cVar1 == '/') {
        if (sVar25 == 0) {
LAB_00114dd7:
          lVar7._0_4_ = (fh->faup).features.resource_path.field;
          lVar7._4_4_ = (fh->faup).features.resource_path.pos;
          if (lVar7 < 0) {
            lVar8._0_4_ = (features->scheme).field;
            lVar8._4_4_ = (features->scheme).pos;
            if (lVar8 < 0) {
              lVar14._0_4_ = (fh->faup).features.hierarchical.field;
              lVar14._4_4_ = (fh->faup).features.hierarchical.pos;
              if (lVar14 < 0) goto LAB_00114df8;
            }
            else {
              lVar9._0_4_ = (fh->faup).features.host.field;
              lVar9._4_4_ = (fh->faup).features.host.pos;
              if (-1 < lVar9) {
LAB_00114df8:
                (fh->faup).features.resource_path.pos = iVar24;
                uVar22 = 2;
              }
            }
          }
        }
        else {
          if (url[sVar25 - 1] == '\\') goto LAB_00114b74;
          if ((lVar23 != 0) || (url[sVar25 - 1] != ':')) goto LAB_00114dd7;
          if (uVar22 < 2) {
            (fh->faup).features.hierarchical.pos = iVar24 + -1;
            lVar19 = -1;
            if (sVar25 != 1) {
              lVar19 = (long)url[sVar25 - 2];
            }
            ppuVar17 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar17 + lVar19 * 2 + 1) & 4) != 0) {
              (fh->faup).features.scheme.pos = 0;
            }
            (fh->faup).features.host.pos = -1;
            (fh->faup).features.port.pos = -1;
            uVar22 = 1;
          }
        }
        lVar10._0_4_ = (fh->faup).features.host.field;
        lVar10._4_4_ = (fh->faup).features.host.pos;
        if (-1 < lVar10) {
          uVar22 = 2;
        }
      }
      else {
        if (sVar25 == 0) {
          (fh->faup).features.host.pos = 0;
        }
        lVar4._0_4_ = (fh->faup).features.host.field;
        lVar4._4_4_ = (fh->faup).features.host.pos;
        if ((lVar4 < 0) &&
           (lVar5._0_4_ = (fh->faup).features.credential.field,
           lVar5._4_4_ = (fh->faup).features.credential.pos, lVar5 < 0)) {
          (fh->faup).features.host.pos = iVar24;
        }
      }
    }
LAB_00114b74:
    lVar23 = lVar23 + (ulong)(cVar1 == '/');
    sVar20 = sVar21;
    sVar25 = uVar26;
  } while( true );
}

Assistant:

void faup_features_find(faup_handler_t *fh, const char *url, const size_t url_len)
{
	faup_features_t* url_features = &fh->faup.features;
	char c;
	char next_c;
	size_t nb_slashes = 0;
	//int char_counter[128];
	int last_slash_pos = 0;
	const char *url_o = url;	/* We keep the original pointer as we move it */
	ssize_t whatever_len = 0;

	faup_last_slash_t last_slash_meaning = FAUP_LAST_SLASH_NOTFOUND;
	char host_is_ipv6 = 0;

	ssize_t current_pos = 0;
	ssize_t buffer_pos = 0;
	size_t i;

	size_t special_char_after_colons_pos = -1;


	faup_features_init(url_features);

	for (i = 0; i < url_len; i++) {
		c = url[i];

		if ((i + 1) < url_len) {
			next_c = url[i+1];
		} else {
			next_c = '\0';
		}

		if (c == '/') {
			nb_slashes++;
		}

		/* printf("reading %c, bufferpos=%d\n", c, buffer_pos); */

		if (host_is_ipv6 && c != ']') {
			current_pos++;
		        continue;
		}

		switch(c) {
			case '/':
				// This is for URLs such as "http://test:\/test@example.com"
				if (get_last_c(url_o, current_pos) == '\\') {
					buffer_pos=-1;
					break;
				}
				/* If it is the first time we have a '/' and previous char is ':' */
				if ((nb_slashes == 1) && (get_last_c(url_o, current_pos) == ':')) {
					if (last_slash_meaning < FAUP_LAST_SLASH_AFTER_DOMAIN) {
						last_slash_meaning = FAUP_LAST_SLASH_HIERARCHICAL;
						url_features->hierarchical.pos = current_pos -1;
						c = get_last_c(url_o, current_pos - 1);
						if (isalpha(c)) {
							url_features->scheme.pos = 0;
						}
						url_features->host.pos = -1; /* So finally we don't start with a host */
						url_features->port.pos = -1; /* So the last ':' we've found was not for a port but for  */
					} /* if (last_slash_meaning < FAUP_LAST_SLASH_AFTER_DOMAIN) */
				} else {
					/* We now check for the resource path */
					if (!faup_features_exist(url_features->resource_path)) {
						if (!faup_features_exist(url_features->scheme)) {
							if (!faup_features_exist(url_features->hierarchical)) {
								/* This host has a '/' with no hierarchy */
								/* The seen '/' is not a hierarchy so it is something like foo/bar.html */
								last_slash_meaning = FAUP_LAST_SLASH_AFTER_DOMAIN;
								url_features->resource_path.pos = current_pos;
							}
						} else {
							if (faup_features_exist(url_features->host)) {
								last_slash_meaning = FAUP_LAST_SLASH_AFTER_DOMAIN;
								url_features->resource_path.pos = current_pos;
							}
						}
					}
				}

				last_slash_pos = current_pos;

				if (faup_features_exist(url_features->host)) {
					last_slash_meaning = FAUP_LAST_SLASH_AFTER_DOMAIN;
				}

				buffer_pos=-1;
				break;
			case '@':
				if (last_slash_meaning < FAUP_LAST_SLASH_AFTER_DOMAIN) {
					if (special_char_after_colons_pos != current_pos) {
						if (!faup_features_exist(url_features->credential)) {
							if (get_last_c(url_o, current_pos) == '@') {
								break;
							}

							whatever_len = buffer_pos;
							if ((last_slash_meaning == FAUP_LAST_SLASH_HIERARCHICAL) || /* This '@' belongs to the authentication if http://foo:bar@host/blah */
									(last_slash_meaning == FAUP_LAST_SLASH_NOTFOUND)) {     /* This '@' belongs to the authentication if foo:bar@host/blah */
								url_features->credential.pos = url_features->host.pos; /* The credential starts where we thought it was a pos */
								url_features->host.pos = current_pos + 1;
								url_features->port.pos = -1; /* So the last ':' we've found was not for a port but for credential */
							} else {
								if (special_char_after_colons_pos != url_features->hierarchical.pos) {
									// That '/' belongs to the password after colons ':'
									last_slash_meaning = FAUP_LAST_SLASH_HIERARCHICAL;
									url_features->credential.pos = url_features->host.pos; 
									url_features->host.pos = current_pos + 1;
									url_features->port.pos = -1;
									url_features->resource_path.pos = -1;
								}
							}
						}
					}
				}
				buffer_pos=-1;
				break;
			case ':':
				/* We have three cases here:
				   - a ':' for the credential
				   - a ':' for the port number
				   - a ':' in the query request */
				if (!faup_features_exist(url_features->port)) {
					if (last_slash_meaning < FAUP_LAST_SLASH_AFTER_DOMAIN) {
						if (isalnum(next_c)) {
							// Skip a special char that may come after a port. Thus, this would not be a port.
							url_features->port.pos = current_pos + 1;
						} else {
						  if (next_c != ':') {
							special_char_after_colons_pos = current_pos + 1;
						  } else {
						    /* In this case we discovered a dot after the other. It it most likely an IPv6 address */
						    if (url_features->host.pos < 0) {
						      url_features->host.pos = current_pos;
						      host_is_ipv6 = 1;
						      fh->faup.url_type = FAUP_URL_IPV6;
						    }

						  }
						}
					}
				}

				buffer_pos=-1;

				break;
			case '?':
				/* printf("Current pos:%zd, special_char:%zd\n", current_pos, special_char_after_colons_pos); */
				if (special_char_after_colons_pos != current_pos) {
					if (last_slash_meaning == FAUP_LAST_SLASH_AFTER_DOMAIN) {
					  if (!faup_features_exist(url_features->query_string)) {
					    url_features->query_string.pos = current_pos;
					  }
					} else if (last_slash_meaning < FAUP_LAST_SLASH_AFTER_DOMAIN) {
					  /* printf("Before last slash after domain"); */
					  if (!faup_features_exist(url_features->resource_path)) {
						if (!faup_features_exist(url_features->scheme)) {
							if (!faup_features_exist(url_features->hierarchical)) {
								/* This host has a '/' with no hierarchy */
								/* The seen '/' is not a hierarchy so it is something like foo/bar.html */
								last_slash_meaning = FAUP_LAST_SLASH_AFTER_DOMAIN;
								if (!faup_features_exist(url_features->query_string)) {
								  url_features->query_string.pos = current_pos;
								}
							}
						} else {
							if (faup_features_exist(url_features->host)) {
								last_slash_meaning = FAUP_LAST_SLASH_AFTER_DOMAIN;
								if (!faup_features_exist(url_features->query_string)) {
								  url_features->query_string.pos = current_pos;
								}
							}
						}
					}

					}
					
				}

				buffer_pos=-1;
				break;
			case '#':
				if (special_char_after_colons_pos != current_pos) {
				  /* I was checking for FAUP_LAST_SLASH_AFTER_DOMAIN for a reason I ignore. I removed that check and all the tests are passing. \o/ */
				  /* if ((last_slash_meaning == FAUP_LAST_SLASH_AFTER_DOMAIN) && (!faup_features_exist(url_features->fragment))) { */
				  if (!faup_features_exist(url_features->fragment)) {
				    url_features->fragment.pos = current_pos;
				  }
				}

				buffer_pos=-1;
				break;
		    case '[': /* This can be an IPv6 URL, see RFC 2732*/
				if (url_features->host.pos < 0) {
				  url_features->host.pos = current_pos;
				  host_is_ipv6 = 1;
				}
			    break;
		    case ']':
			    host_is_ipv6 = 0; /* We stop handle the special IPv6 case*/
			    break;
			default:
				//fh->allocated_buf[buffer_pos] = c;
				if (current_pos == 0) {
					/* We assume we have a host to start. We shall turn it back to -1 if we have a scheme or hierachy */
					url_features->host.pos = 0;
				}
				/* We have a scheme, but no host nor no credential, then host is current_pos until we have a credential to remove it */
				if ((!faup_features_exist(url_features->host)) && 
						(!faup_features_exist(url_features->credential))) {
					url_features->host.pos = current_pos;

				}

				break;
		}

		buffer_pos++;
		current_pos++;
	}

		// faup_features_debug("features", &fh->faup.features);
}